

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.hpp
# Opt level: O1

valarray<double> __thiscall
sciplot::linspace<float,float,double>(sciplot *this,float x0,float x1,size_t numintervals)

{
  ulong __n;
  void *__s;
  double *extraout_RDX;
  ulong uVar1;
  undefined1 auVar2 [16];
  valarray<double> vVar3;
  
  *(size_t *)this = numintervals + 1;
  __n = numintervals * 8 + 8;
  __s = operator_new(__n);
  *(void **)(this + 8) = __s;
  uVar1 = 0;
  memset(__s,0,__n);
  auVar2._8_4_ = (int)(numintervals >> 0x20);
  auVar2._0_8_ = numintervals;
  auVar2._12_4_ = 0x45300000;
  do {
    *(double *)((long)__s + uVar1 * 8) =
         (double)((float)uVar1 * (x1 - x0)) /
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)numintervals) - 4503599627370496.0)) + (double)x0;
    uVar1 = uVar1 + 1;
  } while (numintervals + 1 + (ulong)(numintervals + 1 == 0) != uVar1);
  vVar3._M_data = extraout_RDX;
  vVar3._M_size = (size_t)this;
  return vVar3;
}

Assistant:

auto linspace(T0 x0, T1 x1, std::size_t numintervals) -> std::valarray<U>
{
    std::valarray<U> result(numintervals + 1);
    for(std::size_t i = 0; i <= numintervals; ++i)
        result[i] = x0 + i * (x1 - x0) / static_cast<U>(numintervals);
    return result;
}